

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBB.cpp
# Opt level: O1

void __thiscall chrono::collision::CHOBB::CHOBB(CHOBB *this)

{
  *(undefined8 *)((long)(this->To).m_data + 0x14) = 0;
  *(undefined8 *)((long)(this->d).m_data + 4) = 0;
  *(undefined8 *)((long)(this->d).m_data + 0xc) = 0;
  *(undefined8 *)((long)(this->d).m_data + 0x14) = 0;
  (this->To).m_data[0] = 0.0;
  (this->To).m_data[1] = 0.0;
  (this->To).m_data[2] = 0.0;
  (this->d).m_data[0] = 0.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  *(undefined1 (*) [16])
   ((this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 1) =
       ZEXT416(0) << 0x40;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  *(undefined1 (*) [16])
   ((this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 5) =
       ZEXT416(0) << 0x40;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  if (this != (CHOBB *)Q_FLIP_AROUND_Y) {
    (this->To).m_data[0] = VNULL;
    (this->To).m_data[1] = DAT_00b90ac0;
    (this->To).m_data[2] = DAT_00b90ac8;
  }
  if (this != (CHOBB *)&DAT_00b90a58) {
    (this->d).m_data[0] = VNULL;
    (this->d).m_data[1] = DAT_00b90ac0;
    (this->d).m_data[2] = DAT_00b90ac8;
  }
  return;
}

Assistant:

CHOBB::CHOBB() {
    first_child = 0;

    Rot.setIdentity();

    To = VNULL;
    d = VNULL;
}